

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

void encodeString(VM vm,Value value)

{
  Value v;
  size_t i;
  String str;
  VM vm_local;
  Value value_local;
  
  if (vm->error_code == 0) {
    writeCommand(vm,Snew);
    v.i = 0;
    while ((v.u < (value.s)->length && (vm->error_code == 0))) {
      encodeInt(vm,(Value)(long)*(char *)((long)&(v.s)->data + (long)(value.s)->data));
      writeCommand(vm,Sadd);
      v.s = (String)((long)&(v.s)->data + 1);
    }
  }
  return;
}

Assistant:

void encodeString(VM vm, Value value) {
    String str = value.s;
    size_t i;
    if (vm->error_code)return;
    writeCommand(vm, Snew);
    for (i = 0; i < str->length; i++) {
        if (vm->error_code)return;
        Value v;
        v.i = str->data[i];
        encodeInt(vm, v);
        writeCommand(vm, Sadd);
    }
}